

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

void rb_remove_node(lyd_meta *root_meta,rb_node **rbt,lyd_node *node,rb_node **removed)

{
  rb_node *prVar1;
  int iVar2;
  lysc_type_bitenum_item *rbn;
  rb_node *prVar3;
  rb_node *prVar4;
  lysc_type_bitenum_item *plVar5;
  uint8_t uVar6;
  long lVar7;
  rb_node *prVar8;
  rb_node **pprVar9;
  rb_node *prVar10;
  rb_node **pprVar11;
  rb_node *old;
  code *pcVar12;
  
  if (((root_meta == (lyd_meta *)0x0) || (rbt == (rb_node **)0x0)) || (node == (lyd_node *)0x0)) {
    __assert_fail("root_meta && rbt && node",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0x3be,
                  "void rb_remove_node(struct lyd_meta *, struct rb_node **, struct lyd_node *, struct rb_node **)"
                 );
  }
  plVar5 = (lysc_type_bitenum_item *)*rbt;
  if (plVar5 == (lysc_type_bitenum_item *)0x0) {
    return;
  }
  rbn = plVar5;
  if (plVar5->exts != (lysc_ext_instance *)node) {
    pcVar12 = rb_compare_lists;
    if (((lysc_node *)plVar5->exts->argument)->nodetype == 8) {
      pcVar12 = rb_compare_leaflists;
    }
    while( true ) {
      iVar2 = (*pcVar12)(plVar5->exts,node);
      lVar7 = 8;
      if ((iVar2 < 1) && (lVar7 = 0x10, -1 < iVar2)) break;
      plVar5 = *(lysc_type_bitenum_item **)((long)&plVar5->name + lVar7);
      if (plVar5 == (lysc_type_bitenum_item *)0x0) {
        return;
      }
    }
    rbn = plVar5;
    if (plVar5->exts != (lysc_ext_instance *)node) {
      rbn = (lysc_type_bitenum_item *)rb_prev((rb_node *)plVar5);
      while ((rbn != (lysc_type_bitenum_item *)0x0 &&
             (iVar2 = (*pcVar12)(rbn->exts,node), iVar2 == 0))) {
        if (rbn->exts == (lysc_ext_instance *)node) goto LAB_0015537b;
        rbn = (lysc_type_bitenum_item *)rb_prev((rb_node *)rbn);
      }
      rbn = (lysc_type_bitenum_item *)rb_next((rb_node *)plVar5);
      while( true ) {
        if (rbn == (lysc_type_bitenum_item *)0x0) {
          return;
        }
        iVar2 = (*pcVar12)(rbn->exts,node);
        if (iVar2 != 0) {
          return;
        }
        if (rbn->exts == (lysc_ext_instance *)node) break;
        rbn = (lysc_type_bitenum_item *)rb_next((rb_node *)rbn);
      }
    }
  }
LAB_0015537b:
  prVar8 = (rb_node *)rbn->ref;
  if ((rb_node *)rbn->dsc == (rb_node *)0x0) {
    prVar3 = (rb_node *)rbn->name;
    uVar6 = *(uint8_t *)&rbn->field_4;
    if (prVar8 != (rb_node *)0x0) goto LAB_0015543f;
    prVar8 = (rb_node *)0x0;
LAB_00155446:
    if (prVar3 == (rb_node *)0x0) {
      *rbt = prVar8;
      prVar3 = (rb_node *)0x0;
    }
    else if ((lysc_type_bitenum_item *)prVar3->left == rbn) {
      prVar3->left = prVar8;
    }
    else {
      prVar3->right = prVar8;
    }
  }
  else {
    if (prVar8 == (rb_node *)0x0) {
      prVar3 = (rb_node *)rbn->name;
      uVar6 = *(uint8_t *)&rbn->field_4;
      prVar8 = (rb_node *)rbn->dsc;
LAB_0015543f:
      prVar8->parent = prVar3;
      goto LAB_00155446;
    }
    do {
      prVar4 = prVar8;
      prVar8 = prVar4->left;
    } while (prVar4->left != (rb_node *)0x0);
    prVar3 = prVar4->parent;
    prVar8 = prVar4->right;
    uVar6 = prVar4->color;
    if (prVar8 != (rb_node *)0x0) {
      prVar8->parent = prVar3;
    }
    pprVar11 = rbt;
    if (prVar3 != (rb_node *)0x0) {
      pprVar11 = &prVar3->right;
      if (prVar3->left == prVar4) {
        pprVar11 = &prVar3->left;
      }
    }
    *pprVar11 = prVar8;
    if ((lysc_type_bitenum_item *)prVar4->parent == rbn) {
      prVar3 = prVar4;
    }
    prVar10 = (rb_node *)rbn->name;
    prVar4->parent = prVar10;
    prVar1 = (rb_node *)rbn->ref;
    prVar4->left = (rb_node *)rbn->dsc;
    prVar4->right = prVar1;
    prVar4->color = *(uint8_t *)&rbn->field_4;
    pprVar11 = rbt;
    if (prVar10 != (rb_node *)0x0) {
      pprVar11 = &prVar10->right;
      if ((lysc_type_bitenum_item *)prVar10->left == rbn) {
        pprVar11 = &prVar10->left;
      }
    }
    *pprVar11 = prVar4;
    ((rb_node *)rbn->dsc)->parent = prVar4;
    if ((rb_node *)rbn->ref != (rb_node *)0x0) {
      ((rb_node *)rbn->ref)->parent = prVar4;
    }
  }
  if (uVar6 == '\0') {
    do {
      prVar4 = prVar3;
      if ((prVar8 != (rb_node *)0x0) && (prVar8->color != '\0')) goto LAB_001556f6;
      if ((prVar8 == *rbt) || (prVar4 == (rb_node *)0x0)) goto LAB_001556f1;
      prVar3 = prVar4->left;
      pprVar11 = rbt;
      if (prVar3 == prVar8) {
        prVar3 = prVar4->right;
        if (prVar3->color == '\x01') {
          prVar3->color = '\0';
          prVar4->color = '\x01';
          prVar8 = prVar3->left;
          prVar4->right = prVar8;
          if (prVar8 != (rb_node *)0x0) {
            prVar8->parent = prVar4;
          }
          prVar8 = prVar4->parent;
          prVar3->parent = prVar8;
          pprVar9 = rbt;
          if (prVar8 != (rb_node *)0x0) {
            pprVar9 = &prVar8->right;
            if (prVar8->left == prVar4) {
              pprVar9 = &prVar8->left;
            }
          }
          *pprVar9 = prVar3;
          prVar3->left = prVar4;
          prVar4->parent = prVar3;
          prVar3 = prVar4->right;
        }
        prVar8 = prVar3->left;
        if ((prVar8 == (rb_node *)0x0) || (prVar8->color == '\0')) {
          prVar10 = prVar3->right;
          if ((prVar10 == (rb_node *)0x0) || (prVar10->color == '\0')) goto LAB_00155567;
LAB_001555b7:
          prVar3->color = prVar4->color;
          prVar4->color = '\0';
LAB_001556af:
          prVar10->color = '\0';
        }
        else {
          prVar10 = prVar3->right;
          if ((prVar10 != (rb_node *)0x0) && (prVar10->color != '\0')) goto LAB_001555b7;
          prVar8->color = '\0';
          prVar3->color = '\x01';
          prVar10 = prVar8->right;
          prVar3->left = prVar10;
          if (prVar10 != (rb_node *)0x0) {
            prVar10->parent = prVar3;
          }
          prVar10 = prVar3->parent;
          prVar8->parent = prVar10;
          pprVar9 = rbt;
          if (prVar10 != (rb_node *)0x0) {
            pprVar9 = &prVar10->right;
            if (prVar10->left == prVar3) {
              pprVar9 = &prVar10->left;
            }
          }
          *pprVar9 = prVar8;
          prVar8->right = prVar3;
          prVar3->parent = prVar8;
          prVar3 = prVar4->right;
          prVar10 = prVar3->right;
          prVar3->color = prVar4->color;
          prVar4->color = '\0';
          if (prVar10 != (rb_node *)0x0) goto LAB_001556af;
        }
        prVar8 = prVar3->left;
        prVar4->right = prVar8;
        if (prVar8 != (rb_node *)0x0) {
          prVar8->parent = prVar4;
        }
        prVar8 = prVar4->parent;
        prVar3->parent = prVar8;
        if (prVar8 != (rb_node *)0x0) {
          pprVar11 = &prVar8->right;
          if (prVar8->left == prVar4) {
            pprVar11 = &prVar8->left;
          }
        }
        pprVar9 = &prVar3->left;
        goto LAB_001556e5;
      }
      if (prVar3->color == '\x01') {
        prVar3->color = '\0';
        prVar4->color = '\x01';
        prVar8 = prVar3->right;
        prVar4->left = prVar8;
        if (prVar8 != (rb_node *)0x0) {
          prVar8->parent = prVar4;
        }
        prVar8 = prVar4->parent;
        prVar3->parent = prVar8;
        pprVar9 = rbt;
        if (prVar8 != (rb_node *)0x0) {
          pprVar9 = &prVar8->right;
          if (prVar8->left == prVar4) {
            pprVar9 = &prVar8->left;
          }
        }
        *pprVar9 = prVar3;
        prVar3->right = prVar4;
        prVar4->parent = prVar3;
        prVar3 = prVar4->left;
      }
      prVar8 = prVar3->left;
      if ((prVar8 != (rb_node *)0x0) && (prVar8->color != '\0')) goto LAB_00155594;
      prVar10 = prVar3->right;
      if ((prVar10 != (rb_node *)0x0) && (prVar10->color != '\0')) goto LAB_00155589;
LAB_00155567:
      prVar3->color = '\x01';
      prVar3 = prVar4->parent;
      prVar8 = prVar4;
    } while( true );
  }
  goto LAB_001556fa;
LAB_00155589:
  if ((prVar8 == (rb_node *)0x0) || (prVar8->color == '\0')) {
    prVar10->color = '\0';
    prVar3->color = '\x01';
    prVar8 = prVar10->left;
    prVar3->right = prVar8;
    if (prVar8 != (rb_node *)0x0) {
      prVar8->parent = prVar3;
    }
    prVar8 = prVar3->parent;
    prVar10->parent = prVar8;
    pprVar9 = rbt;
    if (prVar8 != (rb_node *)0x0) {
      pprVar9 = &prVar8->right;
      if (prVar8->left == prVar3) {
        pprVar9 = &prVar8->left;
      }
    }
    *pprVar9 = prVar10;
    prVar10->left = prVar3;
    prVar3->parent = prVar10;
    prVar3 = prVar4->left;
    prVar8 = prVar3->left;
    prVar3->color = prVar4->color;
    prVar4->color = '\0';
    if (prVar8 != (rb_node *)0x0) goto LAB_0015561d;
  }
  else {
LAB_00155594:
    prVar3->color = prVar4->color;
    prVar4->color = '\0';
LAB_0015561d:
    prVar8->color = '\0';
  }
  prVar8 = prVar3->right;
  prVar4->left = prVar8;
  if (prVar8 != (rb_node *)0x0) {
    prVar8->parent = prVar4;
  }
  prVar8 = prVar4->parent;
  prVar3->parent = prVar8;
  if (prVar8 != (rb_node *)0x0) {
    pprVar11 = &prVar8->right;
    if (prVar8->left == prVar4) {
      pprVar11 = &prVar8->left;
    }
  }
  pprVar9 = &prVar3->right;
LAB_001556e5:
  *pprVar11 = prVar3;
  *pprVar9 = prVar4;
  prVar4->parent = prVar3;
  prVar8 = *rbt;
LAB_001556f1:
  if (prVar8 != (rb_node *)0x0) {
LAB_001556f6:
    prVar8->color = '\0';
  }
LAB_001556fa:
  *removed = (rb_node *)rbn;
  plVar5 = (lysc_type_bitenum_item *)*rbt;
  if (rbn == plVar5) {
    *rbt = (rb_node *)0x0;
    plVar5 = (lysc_type_bitenum_item *)0x0;
  }
  (root_meta->value).field_2.enum_item = plVar5;
  return;
}

Assistant:

static void
rb_remove_node(struct lyd_meta *root_meta, struct rb_node **rbt, struct lyd_node *node, struct rb_node **removed)
{
    struct rb_node *rbn;

    assert(root_meta && rbt && node);

    if (!*rbt) {
        return;
    }

    /* find @p node in the Red-black tree. */
    rbn = rb_find(*rbt, node);
    if (!rbn) {
        /* node was not inserted to the lyds tree due to optimization */
        return;
    }
    assert(RBN_DNODE(rbn) == node);

    /* remove node */
    rbn = rb_remove(rbt, rbn);
    *removed = rbn;
    if (rbn == *rbt) {
        /* rbn was the last node, assurance that root will be set to NULL */
        *rbt = NULL;
    }

    /* the root of the Red-black tree may changed due to removal, so update the pointer to the root */
    RBT_SET(root_meta, *rbt);
}